

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

vector4 * vector4_divide(vector4 *self,vector4 *vT)

{
  float fVar1;
  
  fVar1 = (self->field_0).v[1];
  (self->field_0).v[0] = (self->field_0).v[0] / (vT->field_0).v[0];
  (self->field_0).v[1] = fVar1 / (vT->field_0).v[1];
  (self->field_0).v[2] = (self->field_0).v[2] / (vT->field_0).v[2];
  (self->field_0).v[3] = (self->field_0).v[3] / (vT->field_0).v[3];
  return self;
}

Assistant:

HYPAPI struct vector4 *vector4_divide(struct vector4 *self, const struct vector4 *vT)
{
	self->v[0] /= vT->v[0];
	self->v[1] /= vT->v[1];
	self->v[2] /= vT->v[2];
	self->v[3] /= vT->v[3];
	return self;
}